

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O0

int kvtree_send(kvtree *hash,int rank,MPI_Comm comm)

{
  char *local_40;
  char *buf;
  undefined8 uStack_30;
  int size;
  size_t max_int;
  size_t pack_size;
  MPI_Comm comm_local;
  kvtree *pkStack_10;
  int rank_local;
  kvtree *hash_local;
  
  pack_size = (size_t)comm;
  comm_local._4_4_ = rank;
  pkStack_10 = hash;
  max_int = kvtree_pack_size(hash);
  uStack_30 = 0x7fffffff;
  if (0x7fffffff < max_int) {
    kvtree_abort(-1,"kvtree_send: hash size %lu is bigger than INT_MAX %d @ %s:%d",max_int,
                 0x7fffffff,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                 ,0x24);
  }
  buf._4_4_ = (int)max_int;
  MPI_Send((long)&buf + 4,1,&ompi_mpi_int,comm_local._4_4_,0,pack_size);
  if (0 < buf._4_4_) {
    local_40 = (char *)kvtree_malloc((long)buf._4_4_,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x30);
    kvtree_pack(local_40,pkStack_10);
    MPI_Send(local_40,buf._4_4_,&ompi_mpi_byte,comm_local._4_4_,0,pack_size);
    kvtree_free(&local_40);
  }
  return 0;
}

Assistant:

int kvtree_send(const kvtree* hash, int rank, MPI_Comm comm)
{
  /* get size of hash and check that it doesn't exceed INT_MAX */
  size_t pack_size = kvtree_pack_size(hash);
  size_t max_int = (size_t) INT_MAX;
  if (pack_size > max_int) {
    kvtree_abort(-1, "kvtree_send: hash size %lu is bigger than INT_MAX %d @ %s:%d",
      (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
    );
  }

  /* tell destination how big the pack size is */
  int size = (int) pack_size;
  MPI_Send(&size, 1, MPI_INT, rank, 0, comm);

  /* pack the hash and send it */
  if (size > 0) {
    /* allocate a buffer big enough to pack the hash */
    /* pack the hash, send it, and free our buffer */
    char* buf = (char*) KVTREE_MALLOC((size_t)size);
    kvtree_pack(buf, hash);
    MPI_Send(buf, size, MPI_BYTE, rank, 0, comm);
    kvtree_free(&buf);
  }

  return KVTREE_SUCCESS;
}